

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

byte * __thiscall
Js::InterpreterStackFrame::OP_ProfiledLoopEnd<(Js::LayoutSize)2,true>
          (InterpreterStackFrame *this,byte *ip)

{
  uint loopNumber;
  long lVar1;
  code *pcVar2;
  bool bVar3;
  InterpreterStackFrame IVar4;
  OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *pOVar5;
  FunctionBody *this_00;
  DynamicProfileInfo *pDVar6;
  undefined4 *puVar7;
  byte *local_30;
  byte *ip_local;
  
  local_30 = ip;
  pOVar5 = ByteCodeReader::
           GetLayout<Js::OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
                     ((ByteCodeReader *)this,&local_30);
  loopNumber = pOVar5->C1;
  CheckIfLoopIsHot(this,*(uint *)(this + 0xd0));
  this_00 = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(this + 0x80));
  if ((this_00->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
    pDVar6 = FunctionBody::GetAnyDynamicProfileInfo(this_00);
    BVFixed::Set((pDVar6->loopFlags).ptr,loopNumber * 2);
    if (*(uint *)(this + 0xd0) < DAT_015a4de0) {
      if (*(uint *)(this + 0xd0) == 0) {
        bVar3 = FunctionBody::DoJITLoopBody(*(FunctionBody **)(this + 0x88));
        if (!bVar3) goto LAB_00a54344;
      }
    }
    else {
LAB_00a54344:
      pDVar6 = FunctionBody::GetAnyDynamicProfileInfo(this_00);
      BVFixed::Set((pDVar6->loopFlags).ptr,loopNumber * 2 | 1);
    }
  }
  *(undefined4 *)(this + 0xd0) = 0;
  bVar3 = DynamicProfileInfo::EnableImplicitCallFlags(*(FunctionBody **)(this + 0x88));
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x16ed,
                                "(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()))"
                                ,
                                "Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody())"
                               );
    if (!bVar3) goto LAB_00a54491;
    *puVar7 = 0;
  }
  OP_RecordImplicitCall(this,loopNumber);
  if (*(uint *)(this + 0xd8) == loopNumber) {
    IVar4 = this[0xd6];
    if (((byte)IVar4 & 8) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x16f3,"(!switchProfileMode)","!switchProfileMode");
      if (!bVar3) {
LAB_00a54491:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
      IVar4 = this[0xd6];
    }
    this[0xd6] = (InterpreterStackFrame)((byte)IVar4 | 8);
    *(undefined4 *)(this + 0xd8) = 0xffffffff;
  }
  lVar1 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
  *(byte *)(lVar1 + 0x1570) =
       *(byte *)(lVar1 + 0x1570) | *(byte *)(*(long *)(this + 0xc0) + (ulong)loopNumber);
  if (*(char *)(lVar1 + 0x1658) != '\0') {
    *(char *)(lVar1 + 0x1658) = *(char *)(lVar1 + 0x1658) + -1;
  }
  return local_30;
}

Assistant:

const byte * InterpreterStackFrame::OP_ProfiledLoopEnd(const byte * ip)
    {
        uint32 loopNumber = m_reader.GetLayout<OpLayoutT_Unsigned1<LayoutSizePolicy<layoutSize>>>(ip)->C1;
        if (!profiled && !isAutoProfiling)
        {
            return ip;
        }

        this->CheckIfLoopIsHot(this->currentLoopCounter);
        Js::FunctionBody *fn = this->function->GetFunctionBody();
        if (fn->HasDynamicProfileInfo())
        {
            fn->GetAnyDynamicProfileInfo()->SetLoopInterpreted(loopNumber);
            // If the counter is 0, there is a high chance that some config disabled tracking that information. (ie: -off:jitloopbody)
            // Assume it is valid for memop in this case.
            if (this->currentLoopCounter >= (uint)CONFIG_FLAG(MinMemOpCount) ||
                (this->currentLoopCounter == 0 && !this->m_functionBody->DoJITLoopBody())
                )
            {
                // This flag becomes relevant only if the loop has been interpreted
                fn->GetAnyDynamicProfileInfo()->SetMemOpMinReached(loopNumber);
            }
        }

        this->currentLoopCounter = 0;

        if (profiled)
        {
            Assert(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()));
            OP_RecordImplicitCall(loopNumber);

            if (switchProfileModeOnLoopEndNumber == loopNumber)
            {
                // Stop profiling since the jitted loop body would be exiting the loop
                Assert(!switchProfileMode);
                switchProfileMode = true;
                switchProfileModeOnLoopEndNumber = 0u - 1;
            }
        }

        // Restore the implicit call flags state and add with flags in the loop as well
        ThreadContext *const threadContext = GetScriptContext()->GetThreadContext();
        threadContext->AddImplicitCallFlags(this->savedLoopImplicitCallFlags[loopNumber]);

        threadContext->DecrementLoopDepth();
        return ip;
    }